

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

void __thiscall anon_unknown.dwarf_3ea2e::CLIncludeParser::~CLIncludeParser(CLIncludeParser *this)

{
  cmProcessTools::LineParser::~LineParser(&this->super_LineParser);
  operator_delete(this,0x60);
  return;
}

Assistant:

CLIncludeParser(cm::string_view includePrefix, cmsys::ofstream& depFile,
                  std::ostream& output)
    : IncludePrefix(includePrefix)
    , DepFile(depFile)
    , Output(output)
  {
  }